

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Command * __thiscall
Catch::CommandParser::find(Command *__return_storage_ptr__,CommandParser *this,string *arg)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  allocator<char> local_49;
  string local_48;
  
  if (arg->_M_string_length == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    getArgs(__return_storage_ptr__,this,&local_48,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = 1 < this->m_argc;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)arg);
      if (iVar2 == 0) {
        uVar3 = 1;
      }
      else {
        uVar1 = 2;
        do {
          uVar3 = uVar1;
          bVar4 = uVar3 < this->m_argc;
          if (!bVar4) goto LAB_00130d5f;
          iVar2 = std::__cxx11::string::compare((char *)arg);
          uVar1 = uVar3 + 1;
        } while (iVar2 != 0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,this->m_argv[uVar3],&local_49);
      getArgs(__return_storage_ptr__,this,&local_48,uVar3 + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        return __return_storage_ptr__;
      }
    }
LAB_00130d5f:
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    (__return_storage_ptr__->m_name)._M_string_length = 0;
    (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_args).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_args).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_args).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

Command find( const std::string& arg ) const {
            if( arg.empty() )
                return getArgs( "", 1 );
            else
                for( std::size_t i = 1; i < m_argc; ++i  )
                    if( m_argv[i] == arg )
                        return getArgs( m_argv[i], i+1 );
            return Command();
        }